

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *iLimit;
  BYTE *pBVar2;
  undefined8 *puVar3;
  BYTE *pBVar4;
  undefined8 uVar5;
  U32 lowestValid;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  U32 UVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong *puVar12;
  long lVar13;
  ulong *puVar14;
  seqDef *psVar15;
  BYTE *litEnd;
  uint uVar16;
  ulong *puVar17;
  ulong *puVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  BYTE *pInLoopLimit;
  BYTE *pBVar24;
  int iVar25;
  bool bVar26;
  size_t offsetFound;
  BYTE *litLimit_w;
  uint local_ac;
  size_t local_a0;
  ulong *local_98;
  ulong *local_90;
  ulong *local_88;
  uint local_7c;
  ulong *local_78;
  ulong *local_70;
  long local_68;
  ZSTD_matchState_t *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  seqStore_t *local_48;
  uint *local_40;
  BYTE *local_38;
  
  pBVar24 = (ms->window).base;
  uVar16 = (ms->window).dictLimit;
  local_38 = pBVar24 + uVar16;
  local_4c = *rep;
  puVar17 = (ulong *)((ulong)((int)src == (int)local_38) + (long)src);
  iVar25 = (int)puVar17 - (int)pBVar24;
  uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_50 = iVar25 - uVar21;
  if (iVar25 - uVar16 <= uVar21) {
    local_50 = uVar16;
  }
  if (ms->loadedDictEnd != 0) {
    local_50 = uVar16;
  }
  local_54 = rep[1];
  local_50 = iVar25 - local_50;
  uVar16 = local_54;
  if (local_50 < local_54) {
    uVar16 = 0;
  }
  uVar22 = (ulong)uVar16;
  local_ac = local_4c;
  if (local_50 < local_4c) {
    local_ac = 0;
  }
  iLimit = (ulong *)((long)src + srcSize);
  local_90 = (ulong *)((long)src + (srcSize - 8));
  if (puVar17 < local_90) {
    puVar1 = (ulong *)((long)iLimit - 7);
    local_70 = (ulong *)((long)iLimit + -3);
    local_78 = (ulong *)((long)iLimit + -1);
    local_98 = iLimit + -4;
    local_60 = ms;
    local_48 = seqStore;
    local_40 = rep;
    do {
      local_68 = -(ulong)local_ac;
      local_7c = (uint)uVar22;
      if (local_ac == 0) {
        uVar22 = 0;
      }
      else {
        uVar22 = 0;
        if (*(int *)(((long)puVar17 + 1) - (ulong)local_ac) == *(int *)((long)puVar17 + 1)) {
          puVar12 = (ulong *)((long)puVar17 + 5);
          puVar10 = (ulong *)((long)puVar17 + local_68 + 5);
          puVar18 = puVar12;
          if (puVar12 < puVar1) {
            if (*puVar10 == *puVar12) {
              lVar13 = 0;
              do {
                puVar18 = (ulong *)((long)puVar17 + lVar13 + 0xd);
                if (puVar1 <= puVar18) {
                  puVar10 = (ulong *)((long)puVar17 + local_68 + lVar13 + 0xd);
                  puVar18 = (ulong *)((long)puVar17 + lVar13 + 0xd);
                  goto LAB_005dd09f;
                }
                uVar22 = *(ulong *)((long)puVar17 + lVar13 + local_68 + 0xd);
                uVar19 = *puVar18;
                lVar13 = lVar13 + 8;
              } while (uVar22 == uVar19);
              uVar19 = uVar19 ^ uVar22;
              uVar22 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar13;
            }
            else {
              uVar19 = *puVar12 ^ *puVar10;
              uVar22 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar22 = uVar22 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_005dd09f:
            if ((puVar18 < local_70) && ((int)*puVar10 == (int)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 4);
              puVar10 = (ulong *)((long)puVar10 + 4);
            }
            if ((puVar18 < local_78) && ((short)*puVar10 == (short)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 2);
              puVar10 = (ulong *)((long)puVar10 + 2);
            }
            if (puVar18 < iLimit) {
              puVar18 = (ulong *)((long)puVar18 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar18));
            }
            uVar22 = (long)puVar18 - (long)puVar12;
          }
          uVar22 = uVar22 + 4;
        }
      }
      local_a0 = 999999999;
      sVar6 = ZSTD_BtFindBestMatch_selectMLS(local_60,(BYTE *)puVar17,(BYTE *)iLimit,&local_a0);
      sVar8 = uVar22;
      if (uVar22 < sVar6) {
        sVar8 = sVar6;
      }
      if (sVar8 < 4) {
        uVar22 = (ulong)local_7c;
        puVar17 = (ulong *)((long)puVar17 + ((long)puVar17 - (long)src >> 8) + 1);
      }
      else {
        local_88 = puVar17;
        if (sVar6 <= uVar22) {
          local_a0 = 0;
          local_88 = (ulong *)((long)puVar17 + 1);
        }
        bVar26 = puVar17 < local_90;
        sVar6 = local_a0;
        while (bVar26) {
          puVar12 = (ulong *)((long)puVar17 + 1);
          if (sVar6 == 0) {
            sVar6 = 0;
          }
          else if ((local_ac != 0) && (*(int *)puVar12 == *(int *)((long)puVar12 + local_68))) {
            puVar18 = (ulong *)((long)puVar17 + 5);
            puVar14 = (ulong *)((long)puVar17 + local_68 + 5);
            puVar10 = puVar18;
            if (puVar18 < puVar1) {
              if (*puVar14 == *puVar18) {
                puVar10 = (ulong *)((long)puVar17 + 0xd);
                do {
                  if (puVar1 <= puVar10) {
                    puVar14 = (ulong *)((long)puVar10 + local_68);
                    goto LAB_005dd1fa;
                  }
                  puVar14 = (ulong *)((long)puVar10 + local_68);
                  uVar22 = *puVar10;
                  puVar10 = puVar10 + 1;
                } while (*puVar14 == uVar22);
                uVar22 = uVar22 ^ *puVar14;
                uVar19 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                puVar10 = (ulong *)((long)puVar10 + ((uVar19 >> 3 & 0x1fffffff) - 8));
                goto LAB_005dd238;
              }
              uVar19 = *puVar18 ^ *puVar14;
              uVar22 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar22 = uVar22 >> 3 & 0x1fffffff;
            }
            else {
LAB_005dd1fa:
              if ((puVar10 < local_70) && ((int)*puVar14 == (int)*puVar10)) {
                puVar10 = (ulong *)((long)puVar10 + 4);
                puVar14 = (ulong *)((long)puVar14 + 4);
              }
              if ((puVar10 < local_78) && ((short)*puVar14 == (short)*puVar10)) {
                puVar10 = (ulong *)((long)puVar10 + 2);
                puVar14 = (ulong *)((long)puVar14 + 2);
              }
              if (puVar10 < iLimit) {
                puVar10 = (ulong *)((long)puVar10 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar10));
              }
LAB_005dd238:
              uVar22 = (long)puVar10 - (long)puVar18;
              if (0xfffffffffffffffb < uVar22) goto LAB_005dd26a;
            }
            uVar21 = (int)sVar6 + 1;
            uVar16 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            if ((int)((uVar16 ^ 0x1f) + (int)sVar8 * 3 + -0x1e) < (int)(uVar22 + 4) * 3) {
              sVar6 = 0;
              sVar8 = uVar22 + 4;
              local_88 = puVar12;
            }
          }
LAB_005dd26a:
          local_a0 = 999999999;
          sVar7 = ZSTD_BtFindBestMatch_selectMLS(local_60,(BYTE *)puVar12,(BYTE *)iLimit,&local_a0);
          if (sVar7 < 4) {
LAB_005dd2bb:
            if (local_90 <= puVar12) break;
            puVar12 = (ulong *)((long)puVar17 + 2);
            if (sVar6 == 0) {
              sVar6 = 0;
            }
            else if ((local_ac != 0) && (*(int *)puVar12 == *(int *)((long)puVar12 + local_68))) {
              puVar18 = (ulong *)((long)puVar17 + 6);
              puVar10 = (ulong *)((long)puVar17 + local_68 + 6);
              puVar14 = puVar18;
              if (puVar18 < puVar1) {
                if (*puVar10 == *puVar18) {
                  puVar14 = (ulong *)((long)puVar17 + 0xe);
                  do {
                    if (puVar1 <= puVar14) {
                      puVar10 = (ulong *)(local_68 + (long)puVar14);
                      goto LAB_005dd35a;
                    }
                    puVar17 = (ulong *)((long)puVar14 + local_68);
                    uVar22 = *puVar14;
                    puVar14 = puVar14 + 1;
                  } while (*puVar17 == uVar22);
                  uVar22 = uVar22 ^ *puVar17;
                  uVar19 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  puVar14 = (ulong *)((long)puVar14 + ((uVar19 >> 3 & 0x1fffffff) - 8));
                  goto LAB_005dd39b;
                }
                uVar19 = *puVar18 ^ *puVar10;
                uVar22 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
              }
              else {
LAB_005dd35a:
                if ((puVar14 < local_70) && ((int)*puVar10 == (int)*puVar14)) {
                  puVar14 = (ulong *)((long)puVar14 + 4);
                  puVar10 = (ulong *)((long)puVar10 + 4);
                }
                if ((puVar14 < local_78) && ((short)*puVar10 == (short)*puVar14)) {
                  puVar14 = (ulong *)((long)puVar14 + 2);
                  puVar10 = (ulong *)((long)puVar10 + 2);
                }
                if (puVar14 < iLimit) {
                  puVar14 = (ulong *)((long)puVar14 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar14));
                }
LAB_005dd39b:
                uVar22 = (long)puVar14 - (long)puVar18;
                if (0xfffffffffffffffb < uVar22) goto LAB_005dd3cf;
              }
              uVar21 = (int)sVar6 + 1;
              uVar16 = 0x1f;
              if (uVar21 != 0) {
                for (; uVar21 >> uVar16 == 0; uVar16 = uVar16 - 1) {
                }
              }
              if ((int)((uVar16 ^ 0x1f) + (int)sVar8 * 4 + -0x1e) < (int)(uVar22 + 4) * 4) {
                sVar6 = 0;
                sVar8 = uVar22 + 4;
                local_88 = puVar12;
              }
            }
LAB_005dd3cf:
            local_a0 = 999999999;
            sVar7 = ZSTD_BtFindBestMatch_selectMLS
                              (local_60,(BYTE *)puVar12,(BYTE *)iLimit,&local_a0);
            if (sVar7 < 4) break;
            uVar21 = (int)sVar6 + 1;
            uVar16 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            uVar21 = (int)local_a0 + 1;
            iVar25 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> iVar25 == 0; iVar25 = iVar25 + -1) {
              }
            }
            if ((int)sVar7 * 4 - iVar25 <= (int)((uVar16 ^ 0x1f) + (int)sVar8 * 4 + -0x18)) break;
          }
          else {
            uVar21 = (int)sVar6 + 1;
            uVar16 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            uVar21 = (int)local_a0 + 1;
            iVar25 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> iVar25 == 0; iVar25 = iVar25 + -1) {
              }
            }
            if ((int)sVar7 * 4 - iVar25 <= (int)((uVar16 ^ 0x1f) + (int)sVar8 * 4 + -0x1b))
            goto LAB_005dd2bb;
          }
          puVar17 = puVar12;
          bVar26 = puVar17 < local_90;
          local_88 = puVar17;
          sVar8 = sVar7;
          sVar6 = local_a0;
        }
        puVar17 = local_88;
        if (sVar6 == 0) {
          UVar9 = 1;
          uVar16 = local_ac;
          local_ac = local_7c;
        }
        else {
          if ((src < local_88) && (local_38 < (BYTE *)((long)local_88 + (2 - sVar6)))) {
            puVar12 = local_88;
            while (puVar17 = puVar12,
                  *(BYTE *)((long)puVar12 + -1) == *(BYTE *)((long)puVar12 + (1 - sVar6))) {
              puVar17 = (ulong *)((long)puVar12 + -1);
              sVar8 = sVar8 + 1;
              if ((puVar17 <= src) ||
                 (pBVar24 = (BYTE *)((long)puVar12 + (1 - sVar6)), puVar12 = puVar17,
                 pBVar24 <= local_38)) break;
            }
          }
          UVar9 = (int)sVar6 + 1;
          uVar16 = (int)sVar6 - 2;
        }
        uVar22 = (ulong)local_ac;
        uVar19 = (long)puVar17 - (long)src;
        puVar12 = (ulong *)local_48->lit;
        if (local_98 < puVar17) {
          puVar18 = puVar12;
          puVar10 = (ulong *)src;
          if (src <= local_98) {
            puVar18 = (ulong *)((long)puVar12 + ((long)local_98 - (long)src));
            uVar11 = *(ulong *)((long)src + 8);
            *puVar12 = *src;
            puVar12[1] = uVar11;
            puVar10 = local_98;
            if (0x10 < (long)local_98 - (long)src) {
              lVar13 = 0x10;
              do {
                uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar13) + 8);
                puVar3 = (undefined8 *)((long)puVar12 + lVar13);
                *puVar3 = *(undefined8 *)((long)src + lVar13);
                puVar3[1] = uVar5;
                pBVar24 = (BYTE *)((long)src + lVar13 + 0x10);
                uVar5 = *(undefined8 *)(pBVar24 + 8);
                puVar3[2] = *(undefined8 *)pBVar24;
                puVar3[3] = uVar5;
                lVar13 = lVar13 + 0x20;
              } while (puVar3 + 4 < puVar18);
            }
          }
          if (puVar10 < puVar17) {
            lVar13 = 0;
            do {
              *(BYTE *)((long)puVar18 + lVar13) = *(BYTE *)((long)puVar10 + lVar13);
              lVar13 = lVar13 + 1;
            } while ((long)puVar17 - (long)puVar10 != lVar13);
          }
LAB_005dd5b9:
          local_48->lit = local_48->lit + uVar19;
          psVar15 = local_48->sequences;
          if (0xffff < uVar19) {
            local_48->longLengthType = ZSTD_llt_literalLength;
            local_48->longLengthPos =
                 (U32)((ulong)((long)psVar15 - (long)local_48->sequencesStart) >> 3);
          }
        }
        else {
          uVar11 = *(ulong *)((long)src + 8);
          *puVar12 = *src;
          puVar12[1] = uVar11;
          pBVar24 = local_48->lit;
          if (0x10 < uVar19) {
            uVar11 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar24 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar24 + 0x18) = uVar11;
            if (0x20 < (long)uVar19) {
              lVar13 = 0;
              do {
                pBVar4 = (BYTE *)((long)src + lVar13 + 0x20);
                uVar5 = *(undefined8 *)(pBVar4 + 8);
                pBVar2 = pBVar24 + lVar13 + 0x20;
                *(undefined8 *)pBVar2 = *(undefined8 *)pBVar4;
                *(undefined8 *)(pBVar2 + 8) = uVar5;
                pBVar4 = (BYTE *)((long)src + lVar13 + 0x30);
                uVar5 = *(undefined8 *)(pBVar4 + 8);
                *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar4;
                *(undefined8 *)(pBVar2 + 0x18) = uVar5;
                lVar13 = lVar13 + 0x20;
              } while (pBVar2 + 0x20 < pBVar24 + uVar19);
            }
            goto LAB_005dd5b9;
          }
          local_48->lit = pBVar24 + uVar19;
          psVar15 = local_48->sequences;
        }
        psVar15->litLength = (U16)uVar19;
        psVar15->offset = UVar9;
        if (0xffff < sVar8 - 3) {
          local_48->longLengthType = ZSTD_llt_matchLength;
          local_48->longLengthPos =
               (U32)((ulong)((long)psVar15 - (long)local_48->sequencesStart) >> 3);
        }
        psVar15->matchLength = (U16)(sVar8 - 3);
        psVar15 = psVar15 + 1;
        local_48->sequences = psVar15;
        src = (void *)((long)puVar17 + sVar8);
        bVar26 = local_ac != 0;
        puVar17 = (ulong *)src;
        local_ac = uVar16;
        if ((bVar26) && (src <= local_90)) {
          uVar19 = (ulong)uVar16;
          while( true ) {
            uVar11 = uVar19;
            uVar19 = uVar22;
            uVar22 = uVar19;
            puVar17 = (ulong *)src;
            local_ac = (uint)uVar11;
            if ((int)*src != *(int *)((long)src - uVar19)) break;
            lVar13 = -uVar19;
            puVar17 = (ulong *)((long)src + 4);
            puVar18 = (ulong *)((long)src + lVar13 + 4);
            puVar12 = puVar17;
            if (puVar17 < puVar1) {
              if (*puVar18 == *puVar17) {
                lVar20 = 0;
                do {
                  puVar12 = (ulong *)((long)src + lVar20 + 0xc);
                  if (puVar1 <= puVar12) {
                    puVar18 = (ulong *)((long)src + lVar13 + lVar20 + 0xc);
                    puVar12 = (ulong *)((long)src + lVar20 + 0xc);
                    goto LAB_005dd6d3;
                  }
                  uVar22 = *(ulong *)((long)src + lVar20 + lVar13 + 0xc);
                  uVar23 = *puVar12;
                  lVar20 = lVar20 + 8;
                } while (uVar22 == uVar23);
                uVar23 = uVar23 ^ uVar22;
                uVar22 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar20;
              }
              else {
                uVar23 = *puVar17 ^ *puVar18;
                uVar22 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_005dd6d3:
              if ((puVar12 < local_70) && ((int)*puVar18 == (int)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 4);
                puVar18 = (ulong *)((long)puVar18 + 4);
              }
              if ((puVar12 < local_78) && ((short)*puVar18 == (short)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 2);
                puVar18 = (ulong *)((long)puVar18 + 2);
              }
              if (puVar12 < iLimit) {
                puVar12 = (ulong *)((long)puVar12 + (ulong)((BYTE)*puVar18 == (BYTE)*puVar12));
              }
              uVar22 = (long)puVar12 - (long)puVar17;
            }
            if (src <= local_98) {
              puVar17 = (ulong *)local_48->lit;
              uVar23 = *(ulong *)((long)src + 8);
              *puVar17 = *src;
              puVar17[1] = uVar23;
              psVar15 = local_48->sequences;
            }
            psVar15->litLength = 0;
            psVar15->offset = 1;
            if (0xffff < uVar22 + 1) {
              local_48->longLengthType = ZSTD_llt_matchLength;
              local_48->longLengthPos =
                   (U32)((ulong)((long)psVar15 - (long)local_48->sequencesStart) >> 3);
            }
            psVar15->matchLength = (U16)(uVar22 + 1);
            psVar15 = psVar15 + 1;
            local_48->sequences = psVar15;
            src = (void *)((long)src + uVar22 + 4);
            uVar22 = uVar11;
            puVar17 = (ulong *)src;
            local_ac = (uint)uVar19;
            if (((uint)uVar11 == 0) || (local_90 < src)) break;
          }
        }
      }
      uVar16 = (uint)uVar22;
      rep = local_40;
    } while (puVar17 < local_90);
  }
  uVar21 = 0;
  if (local_50 < local_54) {
    uVar21 = local_54;
  }
  if (local_50 < local_4c) {
    uVar21 = local_4c;
  }
  if (local_ac == 0) {
    local_ac = uVar21;
  }
  if (uVar16 != 0) {
    uVar21 = uVar16;
  }
  *rep = local_ac;
  rep[1] = uVar21;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_noDict);
}